

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O3

bool __thiscall
duckdb_snappy::SnappyDecompressor::ReadUncompressedLength(SnappyDecompressor *this,uint32_t *result)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  long in_RAX;
  undefined4 extraout_var;
  ulong uVar5;
  size_t n;
  long local_38;
  
  *result = 0;
  uVar5 = 0;
  local_38 = in_RAX;
  do {
    iVar3 = (*this->reader_->_vptr_Source[3])(this->reader_,&local_38);
    if (local_38 == 0) {
      return false;
    }
    bVar1 = *(byte *)CONCAT44(extraout_var,iVar3);
    (*this->reader_->_vptr_Source[4])(this->reader_,1);
    uVar4 = bVar1 & 0x7f;
    if (((&LeftShiftOverflows(unsigned_char,unsigned_int)::masks)[uVar5] & (byte)uVar4) != 0) {
      return false;
    }
    *result = *result | uVar4 << ((byte)uVar5 & 0x1f);
    if (-1 < (char)bVar1) {
      return true;
    }
    bVar2 = uVar5 < 0x19;
    uVar5 = uVar5 + 7;
  } while (bVar2);
  return false;
}

Assistant:

bool ReadUncompressedLength(uint32_t* result) {
    assert(ip_ == NULL);  // Must not have read anything yet
    // Length is encoded in 1..5 bytes
    *result = 0;
    uint32_t shift = 0;
    while (true) {
      if (shift >= 32) return false;
      size_t n;
      const char* ip = reader_->Peek(&n);
      if (n == 0) return false;
      const unsigned char c = *(reinterpret_cast<const unsigned char*>(ip));
      reader_->Skip(1);
      uint32_t val = c & 0x7f;
      if (LeftShiftOverflows(static_cast<uint8_t>(val), shift)) return false;
      *result |= val << shift;
      if (c < 128) {
        break;
      }
      shift += 7;
    }
    return true;
  }